

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

void __thiscall llvm::DWARFDebugLine::LineTable::clear(LineTable *this)

{
  LineTable *this_local;
  
  Prologue::clear(&this->Prologue);
  std::vector<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>::clear
            (&this->Rows);
  std::vector<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>::
  clear(&this->Sequences);
  return;
}

Assistant:

void DWARFDebugLine::LineTable::clear() {
  Prologue.clear();
  Rows.clear();
  Sequences.clear();
}